

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O3

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  z_streamp strm;
  undefined1 *puVar1;
  lzx_stream *strm_00;
  undefined1 uVar2;
  short sVar3;
  long lVar4;
  int *piVar5;
  bool bVar6;
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  wchar_t wVar10;
  uint uVar11;
  wchar_t wVar12;
  uint uVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  uint uVar16;
  int iVar17;
  void *pvVar18;
  void *pvVar19;
  int64_t iVar20;
  byte *pbVar21;
  ushort *puVar22;
  void *pvVar23;
  undefined4 *puVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  byte bVar30;
  int iVar31;
  long lVar32;
  char *pcVar33;
  wchar_t wVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  ulong uVar42;
  int *piVar43;
  void *pvVar44;
  undefined1 *__dest;
  size_t __n;
  char cVar45;
  undefined1 auVar46 [16];
  ssize_t bytes_avail;
  ssize_t bytes_avail_1;
  uint local_160;
  uint local_15c;
  uint local_144;
  uint local_134;
  lzx_br local_d8 [5];
  long local_88;
  long local_80;
  ulong local_78;
  int local_6c;
  long local_68;
  long local_60;
  long local_58;
  ulong *local_50;
  byte *local_48;
  size_t local_40;
  long local_38;
  
  pvVar18 = a->format->data;
  wVar10 = cab_next_cfdata(a);
  if (wVar10 < L'\0') {
    *avail = (long)wVar10;
    return (void *)0x0;
  }
  lVar4 = *(long *)((long)pvVar18 + 0x28);
  sVar3 = *(short *)(lVar4 + 6);
  if (sVar3 == 3) {
    pvVar18 = a->format->data;
    lVar4 = *(long *)((long)pvVar18 + 0x38);
    pvVar19 = *(void **)((long)pvVar18 + 0xa0);
    if (pvVar19 == (void *)0x0) {
      *(undefined8 *)((long)pvVar18 + 0xa8) = 0x8000;
      pvVar19 = malloc(0x8000);
      *(void **)((long)pvVar18 + 0xa0) = pvVar19;
      if (pvVar19 == (void *)0x0) {
LAB_0016dd9a:
        pcVar33 = "No memory for CAB reader";
        iVar17 = 0xc;
        goto LAB_0016e1e6;
      }
    }
    uVar8 = *(ushort *)(lVar4 + 0xc);
    uVar27 = (ulong)uVar8;
    uVar9 = *(ushort *)(lVar4 + 8);
    if (uVar8 == uVar9) {
      uVar8 = *(ushort *)(lVar4 + 0xe);
      *avail = uVar27 - uVar8;
      return (void *)((long)pvVar19 + (ulong)uVar8);
    }
    if (*(char *)(*(long *)((long)pvVar18 + 0x28) + 0x5c) != '\0') {
LAB_0016c8b3:
      lVar28 = *(long *)((long)pvVar18 + 0x1b8);
      *(undefined4 *)(lVar28 + 0x70) = 0;
      *(undefined1 *)(lVar28 + 0x75) = 0;
      *(ulong *)((long)pvVar18 + 0x1b0) = uVar27;
      if (uVar8 < uVar9) {
        strm_00 = (lzx_stream *)((long)pvVar18 + 0x188);
        uVar29 = (ulong)uVar9;
LAB_0016c8fa:
        *(ulong *)((long)pvVar18 + 0x1a0) = uVar27 + *(long *)((long)pvVar18 + 0xa0);
        *(ulong *)((long)pvVar18 + 0x1a8) = uVar29 - uVar27;
        pbVar21 = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_78);
        if (0 < (long)local_78) {
          uVar29 = (ulong)*(ushort *)(lVar4 + 6);
          if (uVar29 < local_78) {
            local_78 = uVar29;
          }
          uVar38 = local_78;
          *(byte **)((long)pvVar18 + 0x188) = pbVar21;
          *(ulong *)((long)pvVar18 + 400) = local_78;
          *(undefined8 *)((long)pvVar18 + 0x198) = 0;
          piVar43 = *(int **)((long)pvVar18 + 0x1b8);
          uVar27 = (ulong)(uint)piVar43[0x97];
          if (piVar43[0x97] == 0) {
            if (((local_78 != 0) && (*(char *)((long)piVar43 + 0x75) != '\0')) &&
               (iVar17 = piVar43[0x1c], iVar17 + -0x41 < -0x10)) {
              *(ulong *)(piVar43 + 0x1a) =
                   (ulong)*(byte *)(piVar43 + 0x1d) |
                   (ulong)*pbVar21 << 8 | *(long *)(piVar43 + 0x1a) << 0x10;
              *(byte **)((long)pvVar18 + 0x188) = pbVar21 + 1;
              *(ulong *)((long)pvVar18 + 400) = local_78 - 1;
              piVar43[0x1c] = iVar17 + 0x10;
              *(undefined1 *)((long)piVar43 + 0x75) = 0;
            }
            iVar17 = *piVar43;
            if (iVar17 < 0x12) {
LAB_0016ca0c:
              piVar5 = *(int **)((long)pvVar18 + 0x1b8);
              br = (lzx_br *)(piVar5 + 0x1a);
              iVar17 = *piVar5;
switchD_0016ca34_default:
              switch(iVar17) {
              case 0:
                iVar17 = piVar5[0x1c];
                if (iVar17 < 1) {
                  wVar10 = lzx_br_fillup(strm_00,br);
                  iVar17 = piVar5[0x1c];
                  if (iVar17 < 1 && wVar10 == L'\0') {
                    *piVar5 = 0;
                    goto LAB_0016dc7d;
                  }
                }
                uVar36 = iVar17 - 1;
                cVar45 = (*(ulong *)(piVar5 + 0x1a) >> ((ulong)uVar36 & 0x3f) & 1) != 0;
                *(char *)(piVar5 + 10) = cVar45;
                piVar5[0x1c] = uVar36;
                break;
              case 1:
                cVar45 = (char)piVar5[10];
                uVar36 = piVar5[0x1c];
                break;
              case 2:
                uVar36 = piVar5[0x1c];
                goto LAB_0016cacf;
              case 3:
                iVar17 = piVar5[0x1c];
                goto LAB_0016cb1b;
              case 4:
                uVar36 = piVar5[0x1c];
                goto LAB_0016d924;
              case 5:
              case 6:
              case 7:
                goto switchD_0016ca34_caseD_5;
              case 8:
                goto switchD_0016ca34_caseD_8;
              case 9:
                goto switchD_0016ca34_caseD_9;
              case 10:
                goto switchD_0016ca34_caseD_a;
              case 0xb:
                goto switchD_0016ca34_caseD_b;
              case 0xc:
                goto switchD_0016ca34_caseD_c;
              case 0xd:
                goto switchD_0016ca34_caseD_d;
              case 0xe:
                goto switchD_0016ca34_caseD_e;
              case 0xf:
                goto switchD_0016ca34_caseD_f;
              case 0x10:
                goto switchD_0016ca34_caseD_10;
              case 0x11:
                goto switchD_0016ca34_caseD_11;
              default:
                goto switchD_0016ca34_default;
              }
              if (cVar45 != '\0') {
                if ((int)uVar36 < 0x20) {
                  wVar10 = lzx_br_fillup(strm_00,br);
                  uVar36 = piVar5[0x1c];
                  if ((int)uVar36 < 0x20 && wVar10 == L'\0') {
                    *piVar5 = 1;
                    goto LAB_0016dc7d;
                  }
                }
                cVar45 = (char)uVar36;
                uVar36 = uVar36 - 0x20;
                piVar5[9] = (uint)(*(ulong *)(piVar5 + 0x1a) >> ((byte)uVar36 & 0x3f)) & 0xffff |
                            (int)(*(ulong *)(piVar5 + 0x1a) >> (cVar45 - 0x10U & 0x3f)) << 0x10;
                piVar5[0x1c] = uVar36;
              }
LAB_0016cacf:
              if ((int)uVar36 < 3) {
                wVar10 = lzx_br_fillup(strm_00,br);
                uVar36 = piVar5[0x1c];
                if ((int)uVar36 < 3 && wVar10 == L'\0') {
                  *piVar5 = 2;
                  goto LAB_0016dc7d;
                }
              }
              iVar17 = uVar36 - 3;
              bVar30 = (byte)(*(ulong *)(piVar5 + 0x1a) >> ((byte)iVar17 & 0x3f)) & 7;
              *(byte *)((long)piVar5 + 0x29) = bVar30;
              piVar5[0x1c] = iVar17;
              if (2 < (byte)(bVar30 - 1)) goto LAB_0016dc89;
LAB_0016cb1b:
              if (iVar17 < 0x18) {
                wVar10 = lzx_br_fillup(strm_00,br);
                iVar17 = piVar5[0x1c];
                if (iVar17 < 0x18 && wVar10 == L'\0') {
                  *piVar5 = 3;
                  goto LAB_0016dc7d;
                }
              }
              uVar36 = iVar17 - 0x18;
              uVar27 = *(ulong *)(piVar5 + 0x1a) >> ((byte)uVar36 & 0x3f) & 0xffff |
                       (ulong)(((uint)(*(ulong *)(piVar5 + 0x1a) >> ((char)iVar17 - 8U & 0x3f)) &
                               0xff) << 0x10);
              *(ulong *)(piVar5 + 0xc) = uVar27;
              piVar5[0x1c] = uVar36;
              if (uVar27 == 0) goto LAB_0016dc89;
              *(ulong *)(piVar5 + 0xe) = uVar27;
              iVar17 = 0xb;
              if (*(char *)((long)piVar5 + 0x29) != '\x01') {
                if (*(char *)((long)piVar5 + 0x29) == '\x03') {
LAB_0016d924:
                  if ((uVar36 & 0xf) == 0) {
                    if ((int)uVar36 < 0x10) {
                      wVar10 = lzx_br_fillup(strm_00,br);
                      uVar36 = piVar5[0x1c];
                      if ((int)uVar36 < 0x10 && wVar10 == L'\0') {
                        *piVar5 = 4;
                        goto LAB_0016dc7d;
                      }
                    }
                    uVar36 = uVar36 - 0x10;
                  }
                  else {
                    uVar36 = uVar36 & 0xfffffff0;
                  }
                  piVar5[0x1c] = uVar36;
                  piVar5[0x14] = 0;
                  *piVar5 = 5;
                  goto switchD_0016ca34_caseD_5;
                }
                iVar17 = 10;
              }
              *piVar5 = iVar17;
              goto switchD_0016ca34_default;
            }
            goto LAB_0016cdc8;
          }
          iVar20 = 0;
          goto LAB_0016dd3d;
        }
        pcVar33 = "Truncated CAB file data";
        goto LAB_0016e2ce;
      }
LAB_0016ddb1:
      if ((ulong)*(ushort *)(lVar4 + 6) == 0) {
LAB_0016ddf8:
        pvVar19 = *(void **)((long)pvVar18 + 0xa0);
        if ((10 < uVar9) &&
           (lVar28 = *(long *)((long)pvVar18 + 0x1b8), *(char *)(lVar28 + 0x28) != '\0')) {
          iVar17 = *(int *)(*(long *)((long)pvVar18 + 0x28) + 0x58);
          pvVar44 = (void *)((long)pvVar19 + ((ulong)uVar9 - 10));
          pvVar23 = pvVar19;
          do {
            pvVar23 = memchr(pvVar23,0xe8,(long)pvVar44 - (long)pvVar23);
            if (pvVar23 == (void *)0x0) break;
            iVar26 = ((int)pvVar19 - (int)pvVar23) + iVar17 * -0x8000 + 0x8000;
            iVar31 = *(int *)((long)pvVar23 + 1);
            if ((iVar26 <= iVar31) && (iVar40 = *(int *)(lVar28 + 0x24), iVar31 < iVar40)) {
              if (iVar31 < 0) {
                iVar26 = iVar40;
              }
              *(int *)((long)pvVar23 + 1) = iVar26 + iVar31;
            }
            pvVar23 = (void *)((long)pvVar23 + 5);
          } while (pvVar23 < pvVar44);
          pvVar19 = *(void **)((long)pvVar18 + 0xa0);
        }
        uVar8 = *(ushort *)(lVar4 + 0xe);
        *avail = (uVar27 & 0xffff) - (ulong)uVar8;
        *(short *)(lVar4 + 0xc) = (short)uVar27;
        return (void *)((long)pvVar19 + (ulong)uVar8);
      }
      pvVar19 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar4 + 6),(ssize_t *)local_d8);
      if (0 < (long)local_d8[0].cache_buffer) {
        *(ulong *)(lVar4 + 0x10) = (ulong)*(ushort *)(lVar4 + 6);
        *(void **)(lVar4 + 0x38) = pvVar19;
        iVar20 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar4 + 6));
        if (-1 < iVar20) {
          uVar9 = *(ushort *)(lVar4 + 8);
          goto LAB_0016ddf8;
        }
        goto LAB_0016e33f;
      }
      pcVar33 = "Truncated CAB header";
LAB_0016e2ce:
      iVar17 = 0x54;
LAB_0016e2d6:
      archive_set_error(&a->archive,iVar17,pcVar33);
LAB_0016e33f:
      *avail = -0x1e;
      return (void *)0x0;
    }
    uVar9 = *(ushort *)(*(long *)((long)pvVar18 + 0x28) + 8);
    puVar24 = *(undefined4 **)((long)pvVar18 + 0x1b8);
    if (puVar24 == (undefined4 *)0x0) {
      puVar24 = (undefined4 *)calloc(1,0x260);
      *(undefined4 **)((long)pvVar18 + 0x1b8) = puVar24;
      if (puVar24 != (undefined4 *)0x0) goto LAB_0016df32;
    }
    else {
LAB_0016df32:
      puVar24[0x97] = 0xffffffe7;
      if (0xfffffff8 < uVar9 - 0x16) {
        puVar24[0x97] = 0xffffffe2;
        iVar17 = puVar24[1];
        uVar36 = slots[uVar9 - 0xf];
        iVar31 = 1 << ((byte)uVar9 & 0x1f);
        puVar24[1] = iVar31;
        puVar24[2] = iVar31 + -1;
        if ((*(void **)(puVar24 + 4) == (void *)0x0) || (iVar17 != iVar31)) {
          free(*(void **)(puVar24 + 4));
          pvVar19 = malloc((long)(int)puVar24[1]);
          *(void **)(puVar24 + 4) = pvVar19;
          if (pvVar19 != (void *)0x0) {
            free(*(void **)(puVar24 + 0x18));
            pvVar19 = malloc((long)(int)uVar36 * 8);
            *(void **)(puVar24 + 0x18) = pvVar19;
            if (pvVar19 != (void *)0x0) {
              lzx_huffman_free((huffman *)(puVar24 + 0x5a));
              goto LAB_0016dfd6;
            }
          }
        }
        else {
LAB_0016dfd6:
          lVar28 = 0;
          auVar46 = _DAT_001da570;
          do {
            if (SUB164(auVar46 ^ _DAT_001da580,4) == -0x80000000 &&
                SUB164(auVar46 ^ _DAT_001da580,0) < -0x7fffffee) {
              *(int *)((long)&local_d8[0].cache_buffer + lVar28 * 4) = 1 << ((byte)lVar28 & 0x1f);
              *(int *)((long)&local_d8[0].cache_buffer + lVar28 * 4 + 4) =
                   2 << ((byte)lVar28 & 0x1f);
            }
            lVar28 = lVar28 + 2;
            lVar32 = auVar46._8_8_;
            auVar46._0_8_ = auVar46._0_8_ + 2;
            auVar46._8_8_ = lVar32 + 2;
          } while (lVar28 != 0x12);
          lVar28 = *(long *)(puVar24 + 0x18);
          uVar29 = 1;
          if (1 < (int)uVar36) {
            uVar29 = (ulong)uVar36;
          }
          uVar38 = 0;
          uVar41 = 0;
          uVar11 = 0;
          do {
            if (uVar41 == 0) {
              uVar11 = (uint)uVar38;
LAB_0016e089:
              uVar41 = 0xfffffffe;
              uVar13 = uVar11;
              if (uVar11 != 0) {
                do {
                  uVar41 = uVar41 + 1;
                  bVar6 = 1 < uVar13;
                  uVar13 = (int)uVar13 >> 1;
                } while (bVar6);
              }
              if ((int)uVar41 < 1) {
                uVar41 = 0;
              }
            }
            else {
              uVar11 = uVar11 + *(int *)((long)&local_d8[0].cache_buffer + (ulong)uVar41 * 4);
              if (uVar41 < 0x11) goto LAB_0016e089;
            }
            *(uint *)(lVar28 + uVar38 * 8) = uVar11;
            *(uint *)(lVar28 + 4 + uVar38 * 8) = uVar41;
            uVar38 = uVar38 + 1;
          } while (uVar38 != uVar29);
          puVar24[6] = 0;
          *puVar24 = 0;
          *(undefined8 *)(puVar24 + 0x1a) = 0;
          puVar24[0x1c] = 0;
          puVar24[0x12] = 1;
          *(undefined8 *)(puVar24 + 0x10) = 0x100000001;
          wVar10 = lzx_huffman_init((huffman *)(puVar24 + 0x1e),8,L'\b');
          if ((((wVar10 == L'\0') &&
               (wVar10 = lzx_huffman_init((huffman *)(puVar24 + 0x78),0x14,L'\n'), wVar10 == L'\0'))
              && (wVar10 = lzx_huffman_init((huffman *)(puVar24 + 0x5a),
                                            (long)(int)(uVar36 * 8 + 0x100),L'\x10'),
                 wVar10 == L'\0')) &&
             (wVar10 = lzx_huffman_init((huffman *)(puVar24 + 0x3c),0xf9,L'\x10'), wVar10 == L'\0'))
          {
            puVar24[0x97] = 0;
            *(undefined1 *)(*(long *)((long)pvVar18 + 0x28) + 0x5c) = 1;
            uVar9 = *(ushort *)(lVar4 + 8);
            goto LAB_0016c8b3;
          }
        }
      }
    }
    pcVar33 = "Can\'t initialize LZX decompression.";
LAB_0016e1e1:
    iVar17 = -1;
  }
  else {
    if (sVar3 == 1) {
      pvVar18 = a->format->data;
      lVar4 = *(long *)((long)pvVar18 + 0x38);
      pvVar19 = *(void **)((long)pvVar18 + 0xa0);
      if (pvVar19 == (void *)0x0) {
        *(undefined8 *)((long)pvVar18 + 0xa8) = 0x8000;
        pvVar19 = malloc(0x8000);
        *(void **)((long)pvVar18 + 0xa0) = pvVar19;
        if (pvVar19 == (void *)0x0) goto LAB_0016dd9a;
      }
      uVar8 = *(ushort *)(lVar4 + 0xc);
      if (uVar8 == *(ushort *)(lVar4 + 8)) {
        uVar9 = *(ushort *)(lVar4 + 0xe);
        *avail = (ulong)uVar8 - (ulong)uVar9;
        return (void *)((long)pvVar19 + (ulong)uVar9);
      }
      if (*(char *)(*(long *)((long)pvVar18 + 0x28) + 0x5c) != '\0') {
LAB_0016c6c2:
        uVar36 = (uint)(*(short *)(lVar4 + 6) == *(short *)(lVar4 + 4)) * 2;
        strm = (z_streamp)((long)pvVar18 + 0x110);
        *(ulong *)((long)pvVar18 + 0x138) = (ulong)uVar8;
        do {
          uVar27 = *(ulong *)((long)pvVar18 + 0x138);
          uVar8 = *(ushort *)(lVar4 + 8);
          if (uVar8 <= uVar27) goto LAB_0016c861;
          *(ulong *)((long)pvVar18 + 0x128) = *(long *)((long)pvVar18 + 0xa0) + uVar27;
          *(uint *)((long)pvVar18 + 0x130) = (uint)uVar8 - (int)uVar27;
          pcVar33 = (char *)__archive_read_ahead(a,1,(ssize_t *)local_d8);
          if ((long)local_d8[0].cache_buffer < 1) {
            archive_set_error(&a->archive,0x54,"Truncated CAB header");
            goto LAB_0016e1a9;
          }
          if (*(ushort *)(lVar4 + 6) < local_d8[0].cache_buffer) {
            local_d8[0].cache_buffer = (ulong)*(ushort *)(lVar4 + 6);
          }
          *(char **)((long)pvVar18 + 0x110) = pcVar33;
          *(int *)((long)pvVar18 + 0x118) = (int)local_d8[0].cache_buffer;
          *(undefined8 *)((long)pvVar18 + 0x120) = 0;
          if ((int)uVar36 < 1) {
LAB_0016c7bd:
            bVar6 = false;
            uVar11 = cm_zlib_inflate(strm,0);
            if (uVar11 != 0) {
              if (uVar11 != 1) goto LAB_0016e2f5;
              bVar6 = true;
            }
            iVar20 = *(int64_t *)((long)pvVar18 + 0x120);
            *(int64_t *)(lVar4 + 0x10) = iVar20;
            *(char **)(lVar4 + 0x38) = pcVar33;
            iVar20 = cab_minimum_consume_cfdata(a,iVar20);
            if (iVar20 < 0) {
LAB_0016e1a9:
              *avail = -0x1e;
              return (void *)0x0;
            }
          }
          else {
            uVar27 = (ulong)uVar36;
            if (uVar27 < local_d8[0].cache_buffer) {
              if (((uVar36 == 1) || (*pcVar33 != 'C')) || (pcVar33[1] != 'K')) goto LAB_0016e168;
              *(char **)((long)pvVar18 + 0x110) = pcVar33 + uVar27;
              *(uint *)((long)pvVar18 + 0x118) = (int)local_d8[0].cache_buffer - uVar36;
              *(ulong *)((long)pvVar18 + 0x120) = uVar27;
              uVar36 = 0;
              goto LAB_0016c7bd;
            }
            cVar45 = *pcVar33;
            if (uVar36 == 2) {
              if (cVar45 != 'C') goto LAB_0016e168;
              if (1 < local_d8[0].cache_buffer) {
                cVar45 = pcVar33[1];
                goto joined_r0x0016c819;
              }
            }
            else {
joined_r0x0016c819:
              if (cVar45 != 'K') {
LAB_0016e168:
                archive_set_error(&a->archive,-1,"CFDATA incorrect(no MSZIP signature)");
                *avail = -0x1e;
                return (void *)0x0;
              }
            }
            *(uint64_t *)(lVar4 + 0x10) = local_d8[0].cache_buffer;
            *(char **)(lVar4 + 0x38) = pcVar33;
            iVar20 = cab_minimum_consume_cfdata(a,local_d8[0].cache_buffer);
            if (iVar20 < 0) goto LAB_0016e1a9;
            uVar36 = uVar36 - (int)local_d8[0].cache_buffer;
            bVar6 = false;
          }
        } while (!bVar6);
        uVar27 = *(ulong *)((long)pvVar18 + 0x138);
        uVar8 = *(ushort *)(lVar4 + 8);
LAB_0016c861:
        uVar29 = uVar27 & 0xffff;
        if ((uint)uVar29 < (uint)uVar8) {
          archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar29);
          goto LAB_0016e1ed;
        }
        if ((ulong)*(ushort *)(lVar4 + 6) != 0) {
          pvVar19 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar4 + 6),(ssize_t *)local_d8);
          if ((long)local_d8[0].cache_buffer < 1) {
            archive_set_error(&a->archive,0x54,"Truncated CAB header");
            goto LAB_0016e33f;
          }
          *(ulong *)(lVar4 + 0x10) = (ulong)*(ushort *)(lVar4 + 6);
          *(void **)(lVar4 + 0x38) = pvVar19;
          iVar20 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar4 + 6));
          if (iVar20 < 0) goto LAB_0016e33f;
        }
        if (((int)(uint)*(ushort *)(*(long *)((long)pvVar18 + 0x28) + 4) <=
             *(int *)(*(long *)((long)pvVar18 + 0x28) + 0x58)) ||
           ((uVar11 = cm_zlib_inflateReset(strm), uVar11 == 0 &&
            (uVar11 = cm_zlib_inflateSetDictionary
                                (strm,*(Bytef **)((long)pvVar18 + 0xa0),(uint)*(ushort *)(lVar4 + 8)
                                ), uVar11 == 0)))) {
          uVar8 = *(ushort *)(lVar4 + 0xe);
          lVar28 = *(long *)((long)pvVar18 + 0xa0);
          *avail = uVar29 - uVar8;
          *(short *)(lVar4 + 0xc) = (short)uVar27;
          return (void *)((ulong)uVar8 + lVar28);
        }
LAB_0016e2f5:
        if (uVar11 != 0xfffffffc) {
          pcVar33 = "Deflate decompression failed (%d)";
          uVar27 = (ulong)uVar11;
LAB_0016e31b:
          archive_set_error(&a->archive,-1,pcVar33,uVar27);
          goto LAB_0016e33f;
        }
        pcVar33 = "Out of memory for deflate decompression";
        iVar17 = 0xc;
        goto LAB_0016e2d6;
      }
      *(undefined8 *)((long)pvVar18 + 0x110) = 0;
      *(undefined4 *)((long)pvVar18 + 0x118) = 0;
      *(undefined8 *)((long)pvVar18 + 0x138) = 0;
      *(undefined1 (*) [16])((long)pvVar18 + 0x120) = (undefined1  [16])0x0;
      *(undefined4 *)((long)pvVar18 + 0x130) = 0;
      if (*(char *)((long)pvVar18 + 0x180) == '\0') {
        iVar17 = cm_zlib_inflateInit2_((z_streamp)((long)pvVar18 + 0x110),-0xf,"1.2.3",0x70);
      }
      else {
        iVar17 = cm_zlib_inflateReset((z_streamp)((long)pvVar18 + 0x110));
      }
      if (iVar17 == 0) {
        *(undefined1 *)((long)pvVar18 + 0x180) = 1;
        *(undefined1 *)(*(long *)((long)pvVar18 + 0x28) + 0x5c) = 1;
        goto LAB_0016c6c2;
      }
      pcVar33 = "Can\'t initialize deflate decompression.";
      goto LAB_0016e1e1;
    }
    if (sVar3 != 0) {
      archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                        *(undefined8 *)(lVar4 + 0x10));
      *avail = -0x19;
      return (void *)0x0;
    }
    lVar4 = *(long *)((long)a->format->data + 0x38);
    pvVar18 = __archive_read_ahead(a,1,avail);
    uVar27 = *avail;
    if (0 < (long)uVar27) {
      uVar29 = (ulong)*(ushort *)(lVar4 + 10);
      if (uVar29 < uVar27) {
        *avail = uVar29;
        uVar27 = uVar29;
      }
      *(undefined2 *)(lVar4 + 0xc) = *(undefined2 *)(lVar4 + 8);
      *(ulong *)(lVar4 + 0x10) = uVar27;
      *(void **)(lVar4 + 0x38) = pvVar18;
      return pvVar18;
    }
    pcVar33 = "Truncated CAB header";
    iVar17 = 0x54;
  }
LAB_0016e1e6:
  archive_set_error(&a->archive,iVar17,pcVar33);
LAB_0016e1ed:
  *avail = -0x1e;
  return (void *)0x0;
switchD_0016ca34_caseD_a:
  wVar10 = piVar5[0x1e];
  if (piVar5[0x1c] < wVar10 * 3) {
    wVar12 = lzx_br_fillup(strm_00,br);
    wVar10 = ((huffman *)(piVar5 + 0x1e))->len_size;
    if ((wVar12 == L'\0') && (piVar5[0x1c] < wVar10 * 3)) {
      *piVar5 = 10;
      goto LAB_0016dc7d;
    }
  }
  *(undefined1 (*) [16])(piVar5 + 0x2b) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(piVar5 + 0x27) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(piVar5 + 0x23) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(piVar5 + 0x1f) = (undefined1  [16])0x0;
  piVar5[0x2f] = 0;
  if (L'\0' < wVar10) {
    iVar17 = piVar5[0x1c];
    lVar28 = *(long *)(piVar5 + 0x30);
    lVar32 = 0;
    do {
      *(byte *)(lVar28 + lVar32) =
           (byte)(*(ulong *)(piVar5 + 0x1a) >> ((char)iVar17 - 3U & 0x3f)) & 7;
      lVar28 = *(long *)(piVar5 + 0x30);
      piVar5[(ulong)*(byte *)(lVar28 + lVar32) + 0x1f] =
           piVar5[(ulong)*(byte *)(lVar28 + lVar32) + 0x1f] + 1;
      iVar17 = piVar5[0x1c] + -3;
      piVar5[0x1c] = iVar17;
      lVar32 = lVar32 + 1;
    } while (lVar32 < piVar5[0x1e]);
  }
  wVar10 = lzx_make_huffman_table((huffman *)(piVar5 + 0x1e));
  if (wVar10 == L'\0') goto LAB_0016dc89;
switchD_0016ca34_caseD_b:
  piVar5[0x96] = 0;
switchD_0016ca34_caseD_c:
  wVar10 = lzx_read_pre_tree(strm_00);
  if (wVar10 == L'\0') {
    *piVar5 = 0xc;
    goto LAB_0016dc7d;
  }
  wVar10 = lzx_make_huffman_table((huffman *)(piVar5 + 0x78));
  if (wVar10 == L'\0') goto LAB_0016dc89;
  piVar5[0x96] = 0;
switchD_0016ca34_caseD_d:
  wVar10 = lzx_read_bitlen(strm_00,(huffman *)(piVar5 + 0x5a),L'Ā');
  if (wVar10 < L'\0') goto LAB_0016dc89;
  if (wVar10 == L'\0') {
    *piVar5 = 0xd;
    goto LAB_0016dc7d;
  }
  piVar5[0x96] = 0;
switchD_0016ca34_caseD_e:
  wVar10 = lzx_read_pre_tree(strm_00);
  if (wVar10 == L'\0') {
    *piVar5 = 0xe;
    goto LAB_0016dc7d;
  }
  wVar10 = lzx_make_huffman_table((huffman *)(piVar5 + 0x78));
  if (wVar10 == L'\0') goto LAB_0016dc89;
  piVar5[0x96] = 0x100;
switchD_0016ca34_caseD_f:
  wVar10 = lzx_read_bitlen(strm_00,(huffman *)(piVar5 + 0x5a),L'\xffffffff');
  if (wVar10 < L'\0') goto LAB_0016dc89;
  if (wVar10 == L'\0') {
    *piVar5 = 0xf;
    goto LAB_0016dc7d;
  }
  wVar10 = lzx_make_huffman_table((huffman *)(piVar5 + 0x5a));
  if (wVar10 == L'\0') goto LAB_0016dc89;
  piVar5[0x96] = 0;
switchD_0016ca34_caseD_10:
  wVar10 = lzx_read_pre_tree(strm_00);
  if (wVar10 == L'\0') {
    *piVar5 = 0x10;
    goto LAB_0016dc7d;
  }
  wVar10 = lzx_make_huffman_table((huffman *)(piVar5 + 0x78));
  if (wVar10 == L'\0') goto LAB_0016dc89;
  piVar5[0x96] = 0;
switchD_0016ca34_caseD_11:
  wVar10 = lzx_read_bitlen(strm_00,(huffman *)(piVar5 + 0x3c),L'\xffffffff');
  if (wVar10 < L'\0') goto LAB_0016dc89;
  if (wVar10 == L'\0') {
    *piVar5 = 0x11;
    goto LAB_0016dc7d;
  }
  wVar10 = lzx_make_huffman_table((huffman *)(piVar5 + 0x3c));
  if (wVar10 == L'\0') goto LAB_0016dc89;
  *piVar5 = 0x12;
  if (0x11 < *piVar43) goto code_r0x0016cd9c;
  goto LAB_0016ca0c;
code_r0x0016cd9c:
  piVar43 = *(int **)((long)pvVar18 + 0x1b8);
  iVar17 = *piVar43;
LAB_0016cdc8:
  local_38 = *(long *)((long)pvVar18 + 0x1a8);
  local_50 = (ulong *)(piVar43 + 0x1a);
  local_d8[0].cache_buffer = *(uint64_t *)(piVar43 + 0x1a);
  local_d8[0]._8_8_ = *(undefined8 *)(piVar43 + 0x1c);
  local_60 = *(long *)(piVar43 + 0x18);
  __dest = *(undefined1 **)((long)pvVar18 + 0x1a0);
  puVar1 = __dest + local_38;
  lVar28 = *(long *)(piVar43 + 4);
  local_68 = *(long *)(piVar43 + 0x30);
  local_58 = *(long *)(piVar43 + 0x4e);
  lVar32 = *(long *)(piVar43 + 0x6c);
  uVar35 = *(ulong *)(piVar43 + 0xe);
  local_88 = (long)piVar43[0x32];
  local_80 = (long)piVar43[0x50];
  wVar10 = piVar43[0x6e];
  uVar36 = piVar43[8];
  cVar45 = *(char *)((long)piVar43 + 0x29);
  uVar11 = piVar43[6];
  local_6c = piVar43[1];
  uVar41 = piVar43[2];
  uVar13 = piVar43[0x15];
  wVar12 = piVar43[0x17];
  local_15c = piVar43[0x16];
  local_160 = piVar43[0x10];
  local_48 = pbVar21;
  uVar25 = piVar43[7];
  uVar16 = piVar43[0x12];
  uVar7 = piVar43[0x11];
switchD_0016cf18_default:
  do {
    local_144 = uVar7;
    local_134 = uVar16;
    uVar37 = uVar25;
    iVar31 = iVar17;
    iVar17 = iVar31;
    uVar25 = uVar37;
    uVar16 = local_134;
    uVar7 = local_144;
    switch(iVar31) {
    case 0x12:
      if (uVar35 != 0) {
        do {
          if (puVar1 <= __dest) {
LAB_0016d812:
            iVar31 = 0x12;
            goto LAB_0016d817;
          }
          if (local_d8[0].cache_avail < wVar10) {
            wVar34 = lzx_br_fillup(strm_00,local_d8);
            if ((wVar34 != L'\0') || (wVar10 <= local_d8[0].cache_avail)) goto LAB_0016d007;
            if (uVar38 != uVar29) goto LAB_0016d812;
            uVar39 = (uint)(local_d8[0].cache_buffer <<
                           ((char)wVar10 - (char)local_d8[0]._8_8_ & 0x3fU)) & cache_masks[wVar10];
            uVar25 = piVar43[0x6f];
            iVar17 = piVar43[0x5a];
            uVar8 = *(ushort *)
                     (*(long *)(piVar43 + 0x74) + (ulong)(uVar39 >> ((byte)uVar25 & 0x1f)) * 2);
            uVar27 = (ulong)uVar8;
            if (iVar17 <= (int)(uint)uVar8) {
              uVar42 = uVar27;
              do {
                uVar27 = 0;
                if (((int)uVar25 < 1) ||
                   (iVar26 = (int)uVar42 - iVar17, uVar27 = 0, piVar43[0x71] <= iVar26)) break;
                uVar25 = uVar25 - 1;
                puVar22 = (ushort *)(*(long *)(piVar43 + 0x76) + 2 + (long)iVar26 * 4);
                if ((uVar39 >> (uVar25 & 0x1f) & 1) != 0) {
                  puVar22 = (ushort *)(*(long *)(piVar43 + 0x76) + (long)iVar26 * 4);
                }
                uVar27 = (ulong)*puVar22;
                uVar42 = uVar27;
              } while (iVar17 <= (int)(uint)*puVar22);
            }
            uVar25 = (uint)uVar27;
            iVar17 = local_d8[0].cache_avail - (uint)*(byte *)(lVar32 + uVar27);
            local_d8[0].cache_avail = iVar17;
            if (iVar17 < 0) goto LAB_0016dcce;
          }
          else {
LAB_0016d007:
            uVar39 = (uint)(local_d8[0].cache_buffer >>
                           ((char)local_d8[0].cache_avail - (char)wVar10 & 0x3fU)) &
                     cache_masks[wVar10];
            uVar25 = piVar43[0x6f];
            iVar17 = piVar43[0x5a];
            uVar8 = *(ushort *)
                     (*(long *)(piVar43 + 0x74) + (ulong)(uVar39 >> ((byte)uVar25 & 0x1f)) * 2);
            uVar27 = (ulong)uVar8;
            if (iVar17 <= (int)(uint)uVar8) {
              uVar42 = uVar27;
              do {
                uVar27 = 0;
                if (((int)uVar25 < 1) ||
                   (iVar26 = (int)uVar42 - iVar17, uVar27 = 0, piVar43[0x71] <= iVar26)) break;
                uVar25 = uVar25 - 1;
                puVar22 = (ushort *)(*(long *)(piVar43 + 0x76) + 2 + (long)iVar26 * 4);
                if ((uVar39 >> (uVar25 & 0x1f) & 1) != 0) {
                  puVar22 = (ushort *)(*(long *)(piVar43 + 0x76) + (long)iVar26 * 4);
                }
                uVar27 = (ulong)*puVar22;
                uVar42 = uVar27;
              } while (iVar17 <= (int)(uint)*puVar22);
            }
            uVar25 = (uint)uVar27;
            local_d8[0].cache_avail = local_d8[0].cache_avail - (uint)*(byte *)(lVar32 + uVar27);
          }
          if (0xff < uVar25) goto LAB_0016d137;
          *(char *)(lVar28 + (int)uVar11) = (char)uVar25;
          uVar11 = uVar11 + 1 & uVar41;
          *__dest = (char)uVar25;
          __dest = __dest + 1;
          uVar35 = uVar35 - 1;
          if (uVar35 == 0) break;
        } while( true );
      }
      *piVar43 = 2;
      *local_50 = local_d8[0].cache_buffer;
      local_50[1] = local_d8[0]._8_8_;
      piVar43[0xe] = 0;
      piVar43[0xf] = 0;
      piVar43[8] = uVar36;
      piVar43[7] = uVar37;
      piVar43[0x15] = uVar13;
      piVar43[0x16] = local_15c;
      piVar43[0x10] = local_160;
      piVar43[0x11] = local_144;
      piVar43[0x12] = local_134;
      piVar43[6] = uVar11;
      *(long *)((long)pvVar18 + 0x1a8) = (long)puVar1 - (long)__dest;
      uVar27 = 1;
      goto LAB_0016dce4;
    case 0x13:
      goto LAB_0016d143;
    case 0x14:
      goto LAB_0016d38a;
    case 0x15:
      uVar25 = local_160;
      goto LAB_0016d6b3;
    case 0x16:
      goto LAB_0016d6c2;
    }
  } while( true );
  while (iVar17 != 8) {
switchD_0016ca34_caseD_5:
    iVar17 = piVar5[0x1c];
    if (iVar17 < 0x20) {
      if (iVar17 < 0x10) {
        iVar17 = piVar5[0x14];
        if (3 < iVar17) goto LAB_0016da5d;
      }
      else {
        uVar27 = *(ulong *)(piVar5 + 0x1a) >> ((byte)(iVar17 + -0x10) & 0x3f);
        piVar5[0x1c] = iVar17 + -0x10;
        *(char *)(piVar5 + 0x13) = (char)uVar27;
        *(char *)((long)piVar5 + 0x4d) = (char)(uVar27 >> 8);
        piVar5[0x14] = 2;
        iVar17 = 2;
      }
      if (*(char *)((long)piVar5 + 0x75) != '\0') {
        piVar5[0x14] = iVar17 + 1;
        *(char *)((long)piVar5 + (long)iVar17 + 0x4c) = (char)piVar5[0x1d];
        *(undefined1 *)((long)piVar5 + 0x75) = 0;
        iVar17 = piVar5[0x14];
        if (3 < iVar17) goto LAB_0016da5d;
      }
      lVar28 = *(long *)((long)pvVar18 + 400);
      do {
        if (lVar28 < 1) goto LAB_0016dc7d;
        puVar1 = *(undefined1 **)((long)pvVar18 + 0x188);
        *(undefined1 **)((long)pvVar18 + 0x188) = puVar1 + 1;
        uVar2 = *puVar1;
        piVar5[0x14] = iVar17 + 1;
        *(undefined1 *)((long)piVar5 + (long)iVar17 + 0x4c) = uVar2;
        lVar28 = *(long *)((long)pvVar18 + 400) + -1;
        *(long *)((long)pvVar18 + 400) = lVar28;
        iVar17 = piVar5[0x14];
      } while (iVar17 < 4);
    }
    else {
      uVar35 = *(ulong *)(piVar5 + 0x1a) >> ((char)iVar17 - 0x10U & 0x3f);
      *(char *)(piVar5 + 0x13) = (char)uVar35;
      uVar27 = *(ulong *)(piVar5 + 0x1a) >> ((byte)(iVar17 + -0x20) & 0x3f);
      *(char *)((long)piVar5 + 0x4d) = (char)(uVar35 >> 8);
      piVar5[0x1c] = iVar17 + -0x20;
      *(char *)((long)piVar5 + 0x4e) = (char)uVar27;
      *(char *)((long)piVar5 + 0x4f) = (char)(uVar27 >> 8);
    }
LAB_0016da5d:
    piVar5[0x14] = 0;
    iVar17 = *piVar5;
    if (iVar17 == 5) {
      iVar31 = piVar5[0x13];
      piVar5[0x10] = iVar31;
      iVar17 = 6;
LAB_0016da93:
      if (iVar31 < 0) goto LAB_0016dc89;
      *piVar5 = iVar17;
    }
    else {
      if (iVar17 == 6) {
        iVar31 = piVar5[0x13];
        piVar5[0x11] = iVar31;
        iVar17 = 7;
        goto LAB_0016da93;
      }
      if (iVar17 == 7) {
        piVar5[0x12] = piVar5[0x13];
        if (piVar5[0x13] < 0) goto LAB_0016dc89;
        *piVar5 = 8;
        break;
      }
    }
  }
switchD_0016ca34_caseD_8:
  lVar28 = *(long *)(piVar5 + 0xe);
  if (lVar28 != 0) {
    lVar32 = *(long *)((long)pvVar18 + 0x1a8);
    do {
      uVar27 = 0;
      if (lVar32 < 1) goto LAB_0016dd09;
      uVar35 = *(ulong *)((long)pvVar18 + 400);
      if ((long)uVar35 < 1) {
        if (uVar38 == uVar29) goto LAB_0016dc89;
        goto LAB_0016dd09;
      }
      uVar36 = piVar5[1] - piVar5[6];
      if ((int)(uint)lVar28 <= piVar5[1] - piVar5[6]) {
        uVar36 = (uint)lVar28;
      }
      if (lVar32 < (int)uVar36) {
        uVar36 = (uint)lVar32;
      }
      if ((long)(int)uVar36 <= (long)uVar35) {
        uVar35 = (ulong)uVar36;
      }
      __n = (size_t)(int)uVar35;
      memcpy(*(void **)((long)pvVar18 + 0x1a0),*(void **)((long)pvVar18 + 0x188),__n);
      memcpy((void *)((long)piVar5[6] + *(long *)(piVar5 + 4)),*(void **)((long)pvVar18 + 0x188),__n
            );
      *(long *)((long)pvVar18 + 0x188) = *(long *)((long)pvVar18 + 0x188) + __n;
      *(long *)((long)pvVar18 + 400) = *(long *)((long)pvVar18 + 400) - __n;
      *(long *)((long)pvVar18 + 0x1a0) = *(long *)((long)pvVar18 + 0x1a0) + __n;
      lVar32 = *(long *)((long)pvVar18 + 0x1a8) - __n;
      *(long *)((long)pvVar18 + 0x1a8) = lVar32;
      *(long *)((long)pvVar18 + 0x1b0) = *(long *)((long)pvVar18 + 0x1b0) + __n;
      piVar5[6] = piVar5[6] + (int)uVar35 & piVar5[2];
      lVar28 = *(long *)(piVar5 + 0xe) - __n;
      *(long *)(piVar5 + 0xe) = lVar28;
    } while (lVar28 != 0);
  }
switchD_0016ca34_caseD_9:
  if ((*(byte *)(piVar5 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar18 + 400) < 1) {
      *piVar5 = 9;
LAB_0016dc7d:
      if (uVar38 == uVar29) {
LAB_0016dc89:
        piVar5[0x97] = -0x19;
        uVar27 = 0xffffffe7;
      }
      else {
        uVar27 = 0;
      }
      goto LAB_0016dd09;
    }
    *(long *)((long)pvVar18 + 0x188) = *(long *)((long)pvVar18 + 0x188) + 1;
    *(long *)((long)pvVar18 + 400) = *(long *)((long)pvVar18 + 400) + -1;
  }
  *piVar5 = 2;
  uVar27 = 1;
  goto LAB_0016dd09;
LAB_0016d137:
  uVar13 = uVar25 & 7;
  local_15c = uVar25 - 0x100 >> 3;
LAB_0016d143:
  if (uVar13 == 7) {
    if (local_d8[0].cache_avail < (wchar_t)local_80) {
      wVar34 = lzx_br_fillup(strm_00,local_d8);
      if ((wVar34 != L'\0') || ((wchar_t)local_80 <= local_d8[0].cache_avail)) goto LAB_0016d212;
      if (uVar38 != uVar29) {
        iVar31 = 0x13;
        uVar13 = 7;
        goto LAB_0016d817;
      }
      uVar25 = (uint)(local_d8[0].cache_buffer << ((char)local_80 - (char)local_d8[0]._8_8_ & 0x3fU)
                     ) & cache_masks[local_80];
      uVar36 = piVar43[0x51];
      iVar17 = piVar43[0x3c];
      uVar8 = *(ushort *)(*(long *)(piVar43 + 0x56) + (ulong)(uVar25 >> ((byte)uVar36 & 0x1f)) * 2);
      uVar39 = (uint)uVar8;
      if ((int)(uint)uVar8 < iVar17) {
        uVar27 = (ulong)uVar8;
      }
      else {
        do {
          uVar27 = 0;
          if (((int)uVar36 < 1) || (iVar26 = uVar39 - iVar17, piVar43[0x53] <= iVar26)) break;
          uVar36 = uVar36 - 1;
          puVar22 = (ushort *)(*(long *)(piVar43 + 0x58) + 2 + (long)iVar26 * 4);
          if ((uVar25 >> (uVar36 & 0x1f) & 1) != 0) {
            puVar22 = (ushort *)(*(long *)(piVar43 + 0x58) + (long)iVar26 * 4);
          }
          uVar39 = (uint)*puVar22;
          uVar27 = (ulong)uVar39;
        } while (iVar17 <= (int)uVar39);
      }
      iVar17 = (int)uVar27;
      iVar26 = local_d8[0].cache_avail - (uint)*(byte *)(local_58 + uVar27);
      local_d8[0].cache_avail = iVar26;
      if (iVar26 < 0) goto LAB_0016dcce;
    }
    else {
LAB_0016d212:
      uVar25 = (uint)(local_d8[0].cache_buffer >>
                     ((char)local_d8[0].cache_avail - (char)local_80 & 0x3fU)) &
               cache_masks[local_80];
      uVar36 = piVar43[0x51];
      iVar17 = piVar43[0x3c];
      uVar8 = *(ushort *)(*(long *)(piVar43 + 0x56) + (ulong)(uVar25 >> ((byte)uVar36 & 0x1f)) * 2);
      uVar39 = (uint)uVar8;
      if ((int)(uint)uVar8 < iVar17) {
        uVar27 = (ulong)uVar8;
      }
      else {
        do {
          uVar27 = 0;
          if (((int)uVar36 < 1) || (iVar26 = uVar39 - iVar17, piVar43[0x53] <= iVar26)) break;
          uVar36 = uVar36 - 1;
          puVar22 = (ushort *)(*(long *)(piVar43 + 0x58) + 2 + (long)iVar26 * 4);
          if ((uVar25 >> (uVar36 & 0x1f) & 1) != 0) {
            puVar22 = (ushort *)(*(long *)(piVar43 + 0x58) + (long)iVar26 * 4);
          }
          uVar39 = (uint)*puVar22;
          uVar27 = (ulong)uVar39;
        } while (iVar17 <= (int)uVar39);
      }
      iVar17 = (int)uVar27;
      local_d8[0].cache_avail = local_d8[0].cache_avail - (uint)*(byte *)(local_58 + uVar27);
    }
    uVar36 = iVar17 + 9;
  }
  else {
    uVar36 = uVar13 + 2;
  }
  if (uVar35 < (ulong)(long)(int)uVar36) goto LAB_0016dcce;
  iVar17 = 0x15;
  uVar25 = local_160;
  if (local_15c == 0) goto switchD_0016cf18_default;
  if (local_15c == 2) {
    local_15c = 2;
    uVar25 = local_134;
    uVar16 = local_160;
    local_160 = local_134;
    goto switchD_0016cf18_default;
  }
  if (local_15c == 1) {
    local_15c = 1;
    uVar25 = local_144;
    uVar7 = local_160;
    local_160 = local_144;
    goto switchD_0016cf18_default;
  }
  wVar12 = *(wchar_t *)(local_60 + 4 + (long)(int)local_15c * 8);
LAB_0016d38a:
  if ((cVar45 == '\x02') && (L'\x02' < wVar12)) {
    wVar34 = wVar12 + L'\xfffffffd';
    if (local_d8[0].cache_avail < wVar34) {
      wVar14 = lzx_br_fillup(strm_00,local_d8);
      if ((wVar14 == L'\0') && (local_d8[0].cache_avail < wVar34)) {
joined_r0x0016dcc8:
        iVar31 = 0x14;
        if (uVar38 == uVar29) goto LAB_0016dcce;
        goto LAB_0016d817;
      }
    }
    iVar17 = local_d8[0].cache_avail - wVar34;
    uVar37 = ((uint)(local_d8[0].cache_buffer >> ((byte)iVar17 & 0x3f)) & cache_masks[(uint)wVar34])
             * 8;
    wVar14 = (int)local_88 + wVar34;
    if (local_d8[0].cache_avail < wVar14) {
      wVar15 = lzx_br_fillup(strm_00,local_d8);
      if ((wVar15 != L'\0') || (wVar14 <= local_d8[0].cache_avail)) {
        iVar17 = local_d8[0].cache_avail - wVar34;
        goto LAB_0016d59e;
      }
      if (uVar38 != uVar29) {
        iVar31 = 0x14;
        goto LAB_0016d817;
      }
      uVar16 = (uint)(local_d8[0].cache_buffer <<
                     ((char)local_88 - (char)(local_d8[0].cache_avail - wVar34) & 0x3fU)) &
               cache_masks[local_88];
      uVar25 = piVar43[0x33];
      iVar17 = piVar43[0x1e];
      uVar8 = *(ushort *)(*(long *)(piVar43 + 0x38) + (ulong)(uVar16 >> ((byte)uVar25 & 0x1f)) * 2);
      uVar27 = (ulong)uVar8;
      if (iVar17 <= (int)(uint)uVar8) {
        uVar42 = uVar27;
        do {
          uVar27 = 0;
          if (((int)uVar25 < 1) ||
             (iVar26 = (int)uVar42 - iVar17, uVar27 = 0, piVar43[0x35] <= iVar26)) break;
          uVar25 = uVar25 - 1;
          puVar22 = (ushort *)(*(long *)(piVar43 + 0x3a) + 2 + (long)iVar26 * 4);
          if ((uVar16 >> (uVar25 & 0x1f) & 1) != 0) {
            puVar22 = (ushort *)(*(long *)(piVar43 + 0x3a) + (long)iVar26 * 4);
          }
          uVar27 = (ulong)*puVar22;
          uVar42 = uVar27;
        } while (iVar17 <= (int)(uint)*puVar22);
      }
      iVar26 = (int)uVar27;
      iVar17 = (local_d8[0].cache_avail - wVar34) - (uint)*(byte *)(local_68 + uVar27);
      local_d8[0].cache_avail = iVar17;
      if (iVar17 < 0) goto LAB_0016dcce;
    }
    else {
LAB_0016d59e:
      uVar16 = (uint)(local_d8[0].cache_buffer >> ((char)iVar17 - (char)local_88 & 0x3fU)) &
               cache_masks[local_88];
      uVar25 = piVar43[0x33];
      iVar26 = piVar43[0x1e];
      uVar8 = *(ushort *)(*(long *)(piVar43 + 0x38) + (ulong)(uVar16 >> ((byte)uVar25 & 0x1f)) * 2);
      uVar27 = (ulong)uVar8;
      if (iVar26 <= (int)(uint)uVar8) {
        uVar42 = uVar27;
        do {
          uVar27 = 0;
          if (((int)uVar25 < 1) ||
             (iVar40 = (int)uVar42 - iVar26, uVar27 = 0, piVar43[0x35] <= iVar40)) break;
          uVar25 = uVar25 - 1;
          puVar22 = (ushort *)(*(long *)(piVar43 + 0x3a) + 2 + (long)iVar40 * 4);
          if ((uVar16 >> (uVar25 & 0x1f) & 1) != 0) {
            puVar22 = (ushort *)(*(long *)(piVar43 + 0x3a) + (long)iVar40 * 4);
          }
          uVar27 = (ulong)*puVar22;
          uVar42 = uVar27;
        } while (iVar26 <= (int)(uint)*puVar22);
      }
      iVar26 = (int)uVar27;
      local_d8[0].cache_avail = iVar17 - (uint)*(byte *)(local_68 + uVar27);
    }
    uVar37 = iVar26 + uVar37;
  }
  else {
    if (local_d8[0].cache_avail < wVar12) {
      wVar34 = lzx_br_fillup(strm_00,local_d8);
      if ((wVar34 == L'\0') && (local_d8[0].cache_avail < wVar12)) goto joined_r0x0016dcc8;
    }
    uVar37 = (uint)(local_d8[0].cache_buffer >> ((byte)(local_d8[0].cache_avail - wVar12) & 0x3f)) &
             cache_masks[wVar12];
    local_d8[0].cache_avail = local_d8[0].cache_avail - wVar12;
  }
  uVar37 = (uVar37 + *(int *)(local_60 + (long)(int)local_15c * 8)) - 2;
  local_134 = local_144;
  uVar25 = uVar37;
  local_144 = local_160;
LAB_0016d6b3:
  local_160 = uVar25;
  uVar37 = uVar11 - uVar37 & uVar41;
LAB_0016d6c2:
  do {
    uVar25 = uVar11;
    if ((int)uVar11 < (int)uVar37) {
      uVar25 = uVar37;
    }
    uVar16 = local_6c - uVar25;
    if ((int)uVar36 < (int)(local_6c - uVar25)) {
      uVar16 = uVar36;
    }
    if (puVar1 <= __dest + (int)uVar16) {
      uVar16 = (int)puVar1 - (int)__dest;
    }
    pvVar19 = (void *)((int)uVar37 + lVar28);
    if ((int)uVar16 < 8) {
      if (0 < (int)uVar16) goto LAB_0016d769;
    }
    else if (((int)(uVar16 + uVar37) < (int)uVar11) || ((int)(uVar16 + uVar11) < (int)uVar37)) {
      local_40 = (size_t)uVar16;
      memcpy((void *)((int)uVar11 + lVar28),pvVar19,local_40);
      memcpy(__dest,pvVar19,local_40);
    }
    else {
LAB_0016d769:
      uVar27 = 0;
      do {
        uVar2 = *(undefined1 *)((long)pvVar19 + uVar27);
        *(undefined1 *)((int)uVar11 + lVar28 + uVar27) = uVar2;
        __dest[uVar27] = uVar2;
        uVar27 = uVar27 + 1;
      } while (uVar16 != uVar27);
    }
    __dest = __dest + (int)uVar16;
    uVar37 = uVar37 + uVar16 & uVar41;
    uVar11 = uVar11 + uVar16 & uVar41;
    uVar35 = uVar35 - (long)(int)uVar16;
    iVar17 = 0x16;
    if (__dest < puVar1) {
      iVar17 = iVar31;
    }
    iVar26 = 7;
    if (__dest < puVar1) {
      iVar26 = 0;
    }
    uVar25 = uVar16;
    if ((int)uVar36 <= (int)uVar16) {
      uVar25 = 0;
      iVar17 = iVar31;
    }
    iVar31 = iVar17;
    uVar27 = 10;
    if ((int)uVar36 <= (int)uVar16) {
      iVar26 = 10;
    }
    uVar36 = uVar36 - uVar25;
  } while (iVar26 == 0);
  if (iVar26 != 7) {
    if (iVar26 != 10) goto LAB_0016dce4;
    iVar17 = 0x12;
    uVar25 = uVar37;
    uVar16 = local_134;
    uVar7 = local_144;
    goto switchD_0016cf18_default;
  }
LAB_0016d817:
  *local_50 = local_d8[0].cache_buffer;
  local_50[1] = local_d8[0]._8_8_;
  *(ulong *)(piVar43 + 0xe) = uVar35;
  piVar43[8] = uVar36;
  piVar43[7] = uVar37;
  piVar43[0x15] = uVar13;
  piVar43[0x17] = wVar12;
  piVar43[0x16] = local_15c;
  piVar43[0x10] = local_160;
  piVar43[0x11] = local_144;
  piVar43[0x12] = local_134;
  *piVar43 = iVar31;
  piVar43[6] = uVar11;
  *(long *)((long)pvVar18 + 0x1a8) = (long)puVar1 - (long)__dest;
  uVar27 = 0;
  goto LAB_0016dce4;
LAB_0016dcce:
  piVar43[0x97] = -0x19;
  uVar27 = 0xffffffe7;
LAB_0016dce4:
  lVar28 = local_38 - *(long *)((long)pvVar18 + 0x1a8);
  *(long *)((long)pvVar18 + 0x1a0) = *(long *)((long)pvVar18 + 0x1a0) + lVar28;
  *(long *)((long)pvVar18 + 0x1b0) = *(long *)((long)pvVar18 + 0x1b0) + lVar28;
  pbVar21 = local_48;
LAB_0016dd09:
  iVar20 = (uVar38 - *(long *)((long)pvVar18 + 400)) + *(long *)((long)pvVar18 + 0x198);
  *(int64_t *)((long)pvVar18 + 0x198) = iVar20;
LAB_0016dd3d:
  if (1 < (uint)uVar27) {
    pcVar33 = "LZX decompression failed (%d)";
    goto LAB_0016e31b;
  }
  *(int64_t *)(lVar4 + 0x10) = iVar20;
  *(byte **)(lVar4 + 0x38) = pbVar21;
  iVar20 = cab_minimum_consume_cfdata(a,iVar20);
  if (iVar20 < 0) goto LAB_0016e33f;
  uVar27 = *(ulong *)((long)pvVar18 + 0x1b0);
  uVar9 = *(ushort *)(lVar4 + 8);
  uVar29 = (ulong)uVar9;
  if ((long)uVar29 <= (long)uVar27) goto LAB_0016ddb1;
  goto LAB_0016c8fa;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}